

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

longlong * __thiscall PrimitiveTestClass::FillValues<long_long*>(PrimitiveTestClass *this)

{
  undefined1 auVar1 [16];
  longlong *plVar2;
  ulong uVar3;
  long lVar4;
  long lVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  
  lVar4 = (long)this->SIZE;
  uVar3 = 0xffffffffffffffff;
  if (-1 < lVar4) {
    uVar3 = lVar4 * 8;
  }
  plVar2 = (longlong *)operator_new__(uVar3);
  auVar1 = _DAT_001360a0;
  if (lVar4 != 0) {
    lVar5 = lVar4 + -1;
    auVar6._8_4_ = (int)lVar5;
    auVar6._0_8_ = lVar5;
    auVar6._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar3 = 0;
    auVar6 = auVar6 ^ _DAT_001360a0;
    auVar7 = _DAT_00136090;
    do {
      auVar8 = auVar7 ^ auVar1;
      if ((bool)(~(auVar8._4_4_ == auVar6._4_4_ && auVar6._0_4_ < auVar8._0_4_ ||
                  auVar6._4_4_ < auVar8._4_4_) & 1)) {
        plVar2[uVar3] = 0xff;
      }
      if ((auVar8._12_4_ != auVar6._12_4_ || auVar8._8_4_ <= auVar6._8_4_) &&
          auVar8._12_4_ <= auVar6._12_4_) {
        plVar2[uVar3 + 1] = 0xff;
      }
      uVar3 = uVar3 + 2;
      lVar5 = auVar7._8_8_;
      auVar7._0_8_ = auVar7._0_8_ + 2;
      auVar7._8_8_ = lVar5 + 2;
    } while ((lVar4 + 1U & 0xfffffffffffffffe) != uVar3);
  }
  return plVar2;
}

Assistant:

T FillValues()
        {
            T ret = new typename std::remove_pointer<T>::type[SIZE];
            for (size_t i = 0; i < SIZE; i++)
            {
                ret[i] = 0xFF;
            }
            
            return ret;
        }